

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O1

bool __thiscall ON_PointCloud::SwapCoordinates(ON_PointCloud *this,int i,int j)

{
  bool bVar1;
  bool bVar2;
  
  bVar1 = ON_3dPointArray::SwapCoordinates(&this->m_P,i,j);
  if ((bVar1) && ((this->m_flags & 2) != 0)) {
    bVar1 = ON_Plane::SwapCoordinates(&this->m_plane,i,j);
  }
  if (bVar1 != false) {
    bVar2 = ON_BoundingBox::IsValid(&this->m_bbox);
    if (bVar2) {
      bVar1 = ON_BoundingBox::SwapCoordinates(&this->m_bbox,i,j);
      return bVar1;
    }
  }
  return bVar1;
}

Assistant:

bool ON_PointCloud::SwapCoordinates(
      int i, int j        // indices of coords to swap
      )
{
  bool rc = m_P.SwapCoordinates(i,j);
  if ( rc && HasPlane() ) {
    rc = m_plane.SwapCoordinates(i,j);
  }
  if ( rc && m_bbox.IsValid() ) {
    rc = m_bbox.SwapCoordinates(i,j);
  }
  return rc;
}